

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

int __thiscall IDisk::CompareToDisk(IDisk *this,IDisk *other_disk,bool exact)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  uint *puVar4;
  MFMTrack *local_460;
  MFMTrack *local_450;
  char local_438 [8];
  char str [1024];
  uint track;
  uint maxTrack;
  int side;
  int max_side;
  int idem;
  bool exact_local;
  IDisk *other_disk_local;
  IDisk *this_local;
  
  side = 0;
  pbVar3 = std::max<unsigned_char>(&this->nb_sides_,&other_disk->nb_sides_);
  bVar1 = *pbVar3;
  track = 0;
  do {
    if ((int)(uint)bVar1 <= (int)track || side != 0) {
      return side;
    }
    if ((exact) && (this->side_[(int)track].nb_tracks != other_disk->side_[(int)track].nb_tracks)) {
      return -1;
    }
    puVar4 = std::max<unsigned_int>
                       (&this->side_[(int)track].nb_tracks,&other_disk->side_[(int)track].nb_tracks)
    ;
    str._1020_4_ = *puVar4;
    str[0x3f8] = '\0';
    str[0x3f9] = '\0';
    str[0x3fa] = '\0';
    str[0x3fb] = '\0';
    for (; (uint)str._1016_4_ < (uint)str._1020_4_ && side == 0; str._1016_4_ = str._1016_4_ + 1) {
      if (exact) {
        if (this->side_[(int)track].tracks[(uint)str._1016_4_].size !=
            other_disk->side_[(int)track].tracks[(uint)str._1016_4_].size) {
          return -1;
        }
        if ((this->side_[(int)track].tracks[(uint)str._1016_4_].bitfield == (uchar *)0x0) ||
           (other_disk->side_[(int)track].tracks[(uint)str._1016_4_].bitfield == (uchar *)0x0)) {
          if (this->side_[(int)track].tracks[(uint)str._1016_4_].bitfield !=
              other_disk->side_[(int)track].tracks[(uint)str._1016_4_].bitfield) {
            return -1;
          }
          return 0;
        }
        iVar2 = memcmp(this->side_[(int)track].tracks[(uint)str._1016_4_].bitfield,
                       other_disk->side_[(int)track].tracks[(uint)str._1016_4_].bitfield,
                       (ulong)this->side_[(int)track].tracks[(uint)str._1016_4_].size);
        if (iVar2 != 0) {
          side = -1;
        }
      }
      else {
        if ((uint)str._1016_4_ < this->side_[(int)track].nb_tracks) {
          local_450 = this->side_[(int)track].tracks + (uint)str._1016_4_;
        }
        else {
          local_450 = (MFMTrack *)0x0;
        }
        if ((uint)str._1016_4_ < other_disk->side_[(int)track].nb_tracks) {
          local_460 = other_disk->side_[(int)track].tracks + (uint)str._1016_4_;
        }
        else {
          local_460 = (MFMTrack *)0x0;
        }
        side = CompareTracks(this,local_450,local_460);
        if (side != 0) {
          sprintf(local_438,"Erro track = %i",(ulong)(uint)str._1016_4_);
        }
      }
    }
    track = track + 1;
  } while( true );
}

Assistant:

int IDisk::CompareToDisk(IDisk* other_disk, bool exact)
{
   int idem = 0;

   int max_side = std::max(nb_sides_, other_disk->nb_sides_);

   for (int side = 0; side < max_side && idem == 0; side ++)
   {
      // For each side :
      if (exact && (side_[side].nb_tracks != other_disk->side_[side].nb_tracks))
      {
         return -1;
      }

      unsigned int maxTrack = std::max(side_[side].nb_tracks, other_disk->side_[side].nb_tracks);
      for (unsigned int track = 0; track < maxTrack && idem == 0; track++)
      {
         // For each track :
         // EXACT comparison ?
         if (exact)
         {
            if (side_[side].tracks[track].size != other_disk->side_[side].tracks[track].size)
            {
               return - 1;
            }
            if (side_[side].tracks[track].bitfield != nullptr && other_disk->side_[side].tracks[track].bitfield !=
               nullptr)
            {
               if (memcmp(side_[side].tracks[track].bitfield, other_disk->side_[side].tracks[track].bitfield,
                          side_[side].tracks[track].size) != 0)
               {
                  idem = -1;
               }
            }
            else
            {
               // ok if both are null
               return (side_[side].tracks[track].bitfield == other_disk->side_[side].tracks[track].bitfield) ? 0 : -1;
            }
         }
         else
         {
            // Otherwise...
            idem = CompareTracks((side_[side].nb_tracks > track) ? (&side_[side].tracks[track]) : nullptr,
                                 (other_disk->side_[side].nb_tracks > track)
                                    ? (&other_disk->side_[side].tracks[track])
                                    : nullptr);
            if (idem != 0)
            {
               char str[1024];
               sprintf(str, "Erro track = %i", track);
               //MessageBox(NULL, str, _T("Compare error"), MB_OK);
            }
         }
      }
   }

   return idem;
}